

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

boolean isclearpath(level *lev,coord *cc,int distance,schar dx,schar dy)

{
  boolean bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  
  bVar3 = cc->x;
  bVar2 = cc->y;
  iVar4 = distance + 1;
  while( true ) {
    iVar4 = iVar4 + -1;
    if (iVar4 < 1) {
      cc->x = bVar3;
      cc->y = bVar2;
      return '\x01';
    }
    bVar3 = bVar3 + dx;
    if (0x4e < (byte)(bVar3 - 1)) {
      return '\0';
    }
    bVar2 = bVar2 + dy;
    if (0x14 < bVar2) {
      return '\0';
    }
    if ((byte)lev->locations[(char)bVar3][(char)bVar2].typ < 0x11) break;
    bVar1 = closed_door(lev,(uint)bVar3,(uint)bVar2);
    if (bVar1 != '\0') {
      return '\0';
    }
  }
  return '\0';
}

Assistant:

static boolean isclearpath(struct level *lev, coord *cc, int distance,
			   schar dx, schar dy)
{
	uchar typ;
	xchar x, y;

	x = cc->x;
	y = cc->y;
	while (distance-- > 0) {
		x += dx;
		y += dy;
		typ = lev->locations[x][y].typ;
		if (!isok(x,y) || !ZAP_POS(typ) || closed_door(lev, x,y))
			return FALSE;
	}
	cc->x = x;
	cc->y = y;
	return TRUE;
}